

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O1

Complex __thiscall libDAI::TreeEP::logZ(TreeEP *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Base_ptr p_Var5;
  undefined4 extraout_var_07;
  long lVar6;
  _Rb_tree_header *p_Var7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  TFactor<double> local_98;
  TFactor<double> local_60;
  
  iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                    ();
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x100) !=
      *(long *)(CONCAT44(extraout_var,iVar4) + 0xf8)) {
    lVar8 = 0x20;
    uVar9 = 0;
    do {
      TProb<double>::entropy
                ((TProb<double> *)
                 ((long)&(((this->super_JTree)._Qb.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8));
      uVar9 = uVar9 + 1;
      iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [4])(this);
      lVar8 = lVar8 + 0x38;
    } while (uVar9 < (ulong)((*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x100) -
                              *(long *)(CONCAT44(extraout_var_00,iVar4) + 0xf8) >> 3) *
                            -0x3333333333333333));
  }
  iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                    (this);
  if (*(long *)(CONCAT44(extraout_var_01,iVar4) + 0xe8) !=
      *(long *)(CONCAT44(extraout_var_01,iVar4) + 0xe0)) {
    lVar8 = 0x20;
    uVar9 = 0;
    do {
      TProb<double>::entropy
                ((TProb<double> *)
                 ((long)&(((this->super_JTree)._Qa.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8));
      uVar9 = uVar9 + 1;
      iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [4])(this);
      lVar8 = lVar8 + 0x38;
    } while (uVar9 < (ulong)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0xe8) -
                             *(long *)(CONCAT44(extraout_var_02,iVar4) + 0xe0) >> 6));
  }
  iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                    (this);
  if (*(long *)(CONCAT44(extraout_var_03,iVar4) + 0xe8) !=
      *(long *)(CONCAT44(extraout_var_03,iVar4) + 0xe0)) {
    uVar9 = 0;
    do {
      iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [4])(this);
      TFactor<double>::log0
                (&local_98,
                 (TFactor<double> *)
                 (uVar9 * 0x40 + *(long *)(CONCAT44(extraout_var_04,iVar4) + 0xe0)));
      TFactor<double>::operator*
                (&local_60,&local_98,
                 (this->super_JTree)._Qa.
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar9);
      if ((long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar8 = (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
      }
      if (local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_60._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar9 = uVar9 + 1;
      iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [4])(this);
    } while (uVar9 < (ulong)(*(long *)(CONCAT44(extraout_var_05,iVar4) + 0xe8) -
                             *(long *)(CONCAT44(extraout_var_05,iVar4) + 0xe0) >> 6));
  }
  iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                    (this);
  auVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x48))
                      ((long *)CONCAT44(extraout_var_06,iVar4));
  if (auVar10._0_8_ != 0) {
    p_Var1 = &(this->_Q)._M_t._M_impl.super__Rb_tree_header;
    uVar9 = 0;
    do {
      bVar3 = offtree(this,uVar9);
      if (bVar3) {
        p_Var2 = (this->_Q)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
            p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar9]) {
          if (*(ulong *)(p_Var2 + 1) >= uVar9) {
            p_Var5 = p_Var2;
          }
        }
        p_Var7 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var7 = (_Rb_tree_header *)p_Var5, uVar9 < ((_Rb_tree_header *)p_Var5)->_M_node_count))
        {
          p_Var7 = p_Var1;
        }
        TreeEPSubTree::logZ((TreeEPSubTree *)(p_Var7 + 1),&(this->super_JTree)._Qa,
                            &(this->super_JTree)._Qb);
      }
      uVar9 = uVar9 + 1;
      iVar4 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [4])(this);
      auVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x48))
                          ((long *)CONCAT44(extraout_var_07,iVar4));
    } while (uVar9 < auVar10._0_8_);
  }
  return (Complex)(_ComplexT)auVar10;
}

Assistant:

Complex TreeEP::logZ() const {
        double sum = 0.0;

        // entropy of the tree
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum -= real(_Qb[beta].entropy());
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            sum += real(_Qa[alpha].entropy());

        // energy of the on-tree factors
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            sum += (grm().OR(alpha).log0() * _Qa[alpha]).totalSum();

        // energy of the off-tree factors
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            if( offtree(I) )
                sum += (_Q.find(I))->second.logZ( _Qa, _Qb );
        
        return sum;
    }